

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-future.c
# Opt level: O0

int test(green_loop_t loop)

{
  int iVar1;
  int local_24;
  int *piStack_20;
  int i;
  void *p;
  green_future_t f;
  green_loop_t loop_local;
  
  p = (void *)0x0;
  f = (green_future_t)loop;
  p = green_future_init((green_loop_t)0x0);
  if ((green_future_t)p != (green_future_t)0x0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0xd,"(f) == (((void*)0))");
    abort();
  }
  p = green_future_init((green_loop_t)f);
  if ((green_future_t)p == (green_future_t)0x0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x11,"(f) != (((void*)0))");
    abort();
  }
  piStack_20 = (int *)0x0;
  local_24 = 0;
  iVar1 = green_future_result((green_future_t)0x0,&stack0xffffffffffffffe0,&local_24);
  if (iVar1 != 1) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x17,"(green_future_result(((void*)0), &p, &i)) == (1)");
    abort();
  }
  if (piStack_20 != (int *)0x0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x18,"(p) == (((void*)0))");
    abort();
  }
  if (local_24 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x19,"(i) == (0)");
    abort();
  }
  iVar1 = green_future_set_result((green_future_t)0x0,(void *)0x0,0);
  if (iVar1 != 1) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x1c,"(green_future_set_result(((void*)0), p, i)) == (1)");
    abort();
  }
  iVar1 = green_future_acquire((green_future_t)0x0);
  if (iVar1 != 1) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x1f,"(green_future_acquire(((void*)0))) == (1)");
    abort();
  }
  iVar1 = green_future_release((green_future_t)0x0);
  if (iVar1 != 1) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x20,"(green_future_release(((void*)0))) == (1)");
    abort();
  }
  iVar1 = green_future_result((green_future_t)p,&stack0xffffffffffffffe0,&local_24);
  if (iVar1 != 3) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x23,"(green_future_result(f, &p, &i)) == (3)");
    abort();
  }
  iVar1 = green_future_done((green_future_t)0x0);
  if (iVar1 == 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x26,"(green_future_done(((void*)0))) != (0)");
    abort();
  }
  iVar1 = green_future_done((green_future_t)p);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x29,"(green_future_done(f)) == (0)");
    abort();
  }
  iVar1 = green_future_set_result((green_future_t)p,&local_24,7);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x2c,"(green_future_set_result(f, &i, 7)) == (0)");
    abort();
  }
  iVar1 = green_future_result((green_future_t)p,&stack0xffffffffffffffe0,&local_24);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x2d,"(green_future_result(f, &p, &i)) == (0)");
    abort();
  }
  if (piStack_20 != &local_24) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x2e,"(p) == (&i)");
    abort();
  }
  if (local_24 != 7) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x2f,"(i) == (7)");
    abort();
  }
  iVar1 = green_future_done((green_future_t)p);
  if (iVar1 == 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x32,"(green_future_done(f)) != (0)");
    abort();
  }
  piStack_20 = (int *)0x0;
  local_24 = 0;
  iVar1 = green_future_result((green_future_t)p,&stack0xffffffffffffffe0,(int *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x37,"(green_future_result(f, &p, ((void*)0))) == (0)");
    abort();
  }
  if (piStack_20 != &local_24) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x38,"(p) == (&i)");
    abort();
  }
  if (local_24 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x39,"(i) == (0)");
    abort();
  }
  piStack_20 = (int *)0x0;
  local_24 = 0;
  iVar1 = green_future_result((green_future_t)p,(void **)0x0,&local_24);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x3e,"(green_future_result(f, ((void*)0), &i)) == (0)");
    abort();
  }
  if (piStack_20 != (int *)0x0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x3f,"(p) == (((void*)0))");
    abort();
  }
  if (local_24 != 7) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x40,"(i) == (7)");
    abort();
  }
  iVar1 = green_future_set_result((green_future_t)p,&local_24,7);
  if (iVar1 != 8) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x43,"(green_future_set_result(f, &i, 7)) == (8)");
    abort();
  }
  iVar1 = green_future_release((green_future_t)p);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x46,"(green_future_release(f)) == (0)");
    abort();
  }
  p = (void *)0x0;
  p = green_future_init((green_loop_t)f);
  if ((green_future_t)p == (green_future_t)0x0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x48,"(f) != (((void*)0))");
    abort();
  }
  iVar1 = green_future_cancel((green_future_t)0x0);
  if (iVar1 != 1) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x4b,"(green_future_cancel(((void*)0))) == (1)");
    abort();
  }
  piStack_20 = (int *)0x0;
  local_24 = 0;
  iVar1 = green_future_cancel((green_future_t)p);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x50,"(green_future_cancel(f)) == (0)");
    abort();
  }
  iVar1 = green_future_result((green_future_t)p,&stack0xffffffffffffffe0,&local_24);
  if (iVar1 != 8) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x51,"(green_future_result(f, &p, &i)) == (8)");
    abort();
  }
  iVar1 = green_future_done((green_future_t)p);
  if (iVar1 == 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x52,"(green_future_done(f)) != (0)");
    abort();
  }
  if (piStack_20 != (int *)0x0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x53,"(p) == (((void*)0))");
    abort();
  }
  if (local_24 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x54,"(i) == (0)");
    abort();
  }
  iVar1 = green_future_cancel((green_future_t)p);
  if (iVar1 != 8) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x57,"(green_future_cancel(f)) == (8)");
    abort();
  }
  iVar1 = green_future_set_result((green_future_t)p,(void *)0x0,0);
  if (iVar1 != 4) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x5a,"(green_future_set_result(f, ((void*)0), 0)) == (4)");
    abort();
  }
  iVar1 = green_future_done((green_future_t)p);
  if (iVar1 == 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x5d,"(green_future_done(f)) != (0)");
    abort();
  }
  iVar1 = green_future_release((green_future_t)p);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
            ,0x60,"(green_future_release(f)) == (0)");
    abort();
  }
  return 0;
}

Assistant:

int test(green_loop_t loop)
{
    green_future_t f = NULL;

    // Poller is required.
    f = green_future_init(NULL);
    check_eq(f, NULL);

    // Common case.
    f = green_future_init(loop);
    check_ne(f, NULL);

    void * p = NULL;
    int i = 0;

    // Future is required.
    check_eq(green_future_result(NULL, &p, &i), GREEN_EINVAL);
    check_eq(p, NULL);
    check_eq(i, 0);

    // Future is required.
    check_eq(green_future_set_result(NULL, p, i), GREEN_EINVAL);

    // Future is required.
    check_eq(green_future_acquire(NULL), GREEN_EINVAL);
    check_eq(green_future_release(NULL), GREEN_EINVAL);

    // Check result before completion is not supported.
    check_eq(green_future_result(f, &p, &i), GREEN_EBUSY);

    // Function is NULL-proof.
    check_ne(green_future_done(NULL), 0);

    // Future is not done until set_result is called.
    check_eq(green_future_done(f), 0);

    // Once complete, we should be able to get the result.
    check_eq(green_future_set_result(f, &i, 7), 0);
    check_eq(green_future_result(f, &p, &i), 0);
    check_eq(p, &i);
    check_eq(i, 7);

    // After set_result, future is done.
    check_ne(green_future_done(f), 0);

    // We can get a sub-set of the result.
    p = NULL;
    i = 0;
    check_eq(green_future_result(f, &p, NULL), 0);
    check_eq(p, &i);
    check_eq(i, 0);

    // We can get a sub-set of the result.
    p = NULL;
    i = 0;
    check_eq(green_future_result(f, NULL, &i), 0);
    check_eq(p, NULL);
    check_eq(i, 7);

    // Setting the result again is prohibited.
    check_eq(green_future_set_result(f, &i, 7), GREEN_EBADFD);

    // Let's get us another future.
    check_eq(green_future_release(f), 0); f = NULL;
    f = green_future_init(loop);
    check_ne(f, NULL);

    // Future is required.
    check_eq(green_future_cancel(NULL), GREEN_EINVAL);

    // Once canceled, the future should be done.
    p = NULL;
    i = 0;
    check_eq(green_future_cancel(f), 0);
    check_eq(green_future_result(f, &p, &i), GREEN_EBADFD);
    check_ne(green_future_done(f), 0);
    check_eq(p, NULL);
    check_eq(i, 0);

    // Cannot be canceled twice.
    check_eq(green_future_cancel(f), GREEN_EBADFD);

    // Cannot complete the future after it has been canceled.
    check_eq(green_future_set_result(f, NULL, 0), GREEN_ECANCELED);

    // After set_result, future is done.
    check_ne(green_future_done(f), 0);

    // Done.
    check_eq(green_future_release(f), 0); f = NULL;

    return EXIT_SUCCESS;
}